

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  pointer ppcVar6;
  string local_cf0 [36];
  uint local_ccc;
  string local_cc8 [4];
  uint line_num;
  string code;
  char local_ca8 [5];
  undefined1 local_ca3 [3];
  char cmd [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98 [8];
  string code_1;
  undefined1 local_b70 [4];
  uint i;
  undefined1 local_b60 [8];
  Script script;
  undefined1 local_b30 [8];
  State state;
  Memory memory;
  char **argv_local;
  int argc_local;
  
  LiteScript::Memory::Memory((Memory *)&state.InstructionLine);
  LiteScript::State::State((State *)local_b30,(Memory *)&state.InstructionLine);
  LiteScript::Script::Script((Script *)local_b60,(State *)local_b30);
  LiteScript::CreateVariable((LiteScript *)local_b70,(Memory *)&state.InstructionLine,print_var);
  LiteScript::DeclareVariable((State *)local_b30,"print",(Variable *)local_b70);
  LiteScript::Variable::~Variable((Variable *)local_b70);
  if (1 < argc) {
    readfile_abi_cxx11_((char *)local_b98,(uint *)argv[1]);
    bVar1 = std::operator==(local_b98,"error : can\'t open the file");
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_b98);
      poVar4 = std::operator<<(poVar4," \"");
      poVar4 = std::operator<<(poVar4,argv[1]);
      poVar4 = std::operator<<(poVar4,"\"");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      LiteScript::Script::Execute((Script *)local_b60,pcVar3);
      if (local_b60._0_4_ == SCRPT_ERROR_NO) {
        argv_local._4_4_ = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"ERROR(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b60._4_4_ + 1);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)
                 std::ostream::operator<<(poVar4,script.error + SCRPT_ERROR_SIMPLEARRAY_END);
        poVar4 = std::operator<<(poVar4,"): ");
        pcVar3 = LiteScript::Script::GetError((Script *)local_b60);
        poVar4 = std::operator<<(poVar4,pcVar3);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_b98);
LAB_00139825:
    LiteScript::State::~State((State *)local_b30);
    LiteScript::Memory::~Memory((Memory *)&state.InstructionLine);
    return argv_local._4_4_;
  }
  std::__cxx11::string::string(local_cc8);
  poVar4 = std::operator<<((ostream *)&std::cout,"Enter script code :");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  sVar5 = std::array<const_char_*,_4UL>::size(&command_help);
  ppcVar6 = std::array<const_char_*,_4UL>::data(&command_help);
  display_commands((int)sVar5,ppcVar6);
  do {
    local_ccc = 1;
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::clear();
    while( true ) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_ccc);
      std::operator<<(poVar4," > ");
      std::istream::getline((char *)&std::cin,(long)local_ca8);
      iVar2 = strncmp(local_ca8,"file ",5);
      if (iVar2 == 0) break;
      iVar2 = strncmp(local_ca8,"help",4);
      if (iVar2 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Commands :");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        sVar5 = std::array<const_char_*,_4UL>::size(&command_help);
        ppcVar6 = std::array<const_char_*,_4UL>::data(&command_help);
        display_commands((int)sVar5,ppcVar6);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        iVar2 = strcmp(local_ca8,"exit");
        if (iVar2 == 0) {
          argv_local._4_4_ = 0;
          std::__cxx11::string::~string(local_cc8);
          goto LAB_00139825;
        }
        if (local_ca8[0] == '\0') goto LAB_001396ff;
        std::__cxx11::string::operator+=(local_cc8,local_ca8);
        std::__cxx11::string::operator+=(local_cc8,'\n');
        local_ccc = local_ccc + 1;
      }
    }
    readfile_abi_cxx11_((char *)local_cf0,(uint *)local_ca3);
    std::__cxx11::string::operator+=(local_cc8,local_cf0);
    std::__cxx11::string::~string(local_cf0);
LAB_001396ff:
    std::__cxx11::string::pop_back();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    LiteScript::Script::Execute((Script *)local_b60,pcVar3);
    if (local_b60._0_4_ != SCRPT_ERROR_NO) {
      poVar4 = std::operator<<((ostream *)&std::cout,"ERROR(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b60._4_4_ + 1);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)
               std::ostream::operator<<(poVar4,script.error + SCRPT_ERROR_SIMPLEARRAY_END);
      poVar4 = std::operator<<(poVar4,"): ");
      pcVar3 = LiteScript::Script::GetError((Script *)local_b60);
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    // We create the main memory and the script state
    Memory memory;
    State state(memory);
    // We create an assembly object
    Script script(state);

    // We add the "print" callback in the global namespace
    DeclareVariable(state, "print", CreateVariable(memory, print_var));

    // If there is a parameter, it's a file assembly script to execute
    if (argc > 1) {
        unsigned int i;
        // We read the file content
        std::string code = readfile(argv[1], i);
        if (code == "error : can't open the file") {
            std::cout << code << " \"" << argv[1] << "\"" << std::endl;
            return -1;
        }

        // We execute the script
        script.Execute(code.c_str());
        // If there is an error, we print it
        if (script.error != Script::ErrorType::SCRPT_ERROR_NO) {
            std::cout << "ERROR(" << (script.line_error + 1) << "," << (script.col_error + 1) << "): " << script.GetError() << std::endl;
            return 1;
        }
        return 0;
    }

    // Else we read lines on the keyboard
    // (the script execution is relatively the same as above)
    char cmd[256];
    std::string code;
    unsigned int line_num;
    std::cout << "Enter script code :" << std::endl;
    display_commands(command_help.size(), command_help.data());
    while (true) {
        line_num = 1;
        std::cout << std::endl;
        code.clear();
        while (true) {
            std::cout << line_num << " > ";
            std::cin.getline(cmd, 256);
            if (strncmp(cmd, "file ", 5) == 0) {
                code += readfile(cmd + 5, line_num);
                break;
            }
            else if (strncmp(cmd, "help", 4) == 0) {
                std::cout << "Commands :" << std::endl;
                display_commands(command_help.size(), command_help.data());
                std::cout << std::endl;
                continue;
            }
            else if (strcmp(cmd, "exit") == 0)
                return 0;
            else if (cmd[0] == '\0')
                break;
            code += cmd;
            code += '\n';
            line_num++;
        }
        code.pop_back();

        script.Execute(code.c_str());
        if (script.error != Script::ErrorType::SCRPT_ERROR_NO)
            std::cout << "ERROR(" << (script.line_error + 1) << "," << (script.col_error + 1) << "): " << script.GetError() << std::endl;
    }
}